

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

string * __thiscall ThreadTrackerItem::getAggrStackName_abi_cxx11_(ThreadTrackerItem *this)

{
  reference pvVar1;
  long in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RSI + 8),
                      *(size_type *)(in_RSI + 0x20));
  *pvVar1 = '\0';
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RSI + 8),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pvVar1,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::string getAggrStackName() {
        aggrStackNameRaw[lenName] = 0;
        return &aggrStackNameRaw[0];
    }